

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O3

DistanceEntry * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDistanceEntryForLoop
          (LoopDependenceAnalysis *this,Loop *loop,DistanceVector *distance_vector)

{
  pointer ppLVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (loop != (Loop *)0x0) {
    ppLVar1 = (this->loops_).
              super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(this->loops_).
                  super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1;
    if (lVar2 != 0) {
      lVar2 = lVar2 >> 3;
      lVar3 = 0;
      lVar4 = 0;
      do {
        if (ppLVar1[lVar4] == loop) {
          return (DistanceEntry *)
                 ((long)(distance_vector->entries).
                        super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start - lVar3);
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + -0x28;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
      return (DistanceEntry *)0x0;
    }
  }
  return (DistanceEntry *)0x0;
}

Assistant:

DistanceEntry* LoopDependenceAnalysis::GetDistanceEntryForLoop(
    const Loop* loop, DistanceVector* distance_vector) {
  if (!loop) {
    return nullptr;
  }

  DistanceEntry* distance_entry = nullptr;
  for (size_t loop_index = 0; loop_index < loops_.size(); ++loop_index) {
    if (loop == loops_[loop_index]) {
      distance_entry = &(distance_vector->GetEntries()[loop_index]);
      break;
    }
  }

  return distance_entry;
}